

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O0

void __thiscall
Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>::Block
          (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>
           *this,Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *xpr,Index a_startRow,
          Index a_startCol,Index blockRows,Index blockCols)

{
  bool bVar1;
  Index IVar2;
  BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false,_Eigen::Dense>
  *in_RCX;
  long in_RDX;
  Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *in_R8;
  Index in_R9;
  Index in_stack_ffffffffffffffb8;
  Index in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  
  BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false,_Eigen::Dense>
  ::BlockImpl(in_RCX,in_R8,in_R9,
              CONCAT17(in_stack_ffffffffffffffcf,
                       CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)),
              in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_R8 != (Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *)0x2) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                  ,0x8b,
                  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, BlockRows = 2, BlockCols = -1, InnerPanel = false]"
                 );
  }
  bVar1 = false;
  if (-1 < in_RDX) {
    IVar2 = MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_0>::rows
                      ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>
                        *)0x2f097a);
    bVar1 = false;
    if (((in_RDX <= IVar2 - (long)in_R8) && (bVar1 = false, -1 < (long)in_RCX)) &&
       (bVar1 = false, -1 < in_R9)) {
      IVar2 = MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_0>::cols
                        ((MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_0>
                          *)0x2f09c1);
      bVar1 = (long)in_RCX <= IVar2 - in_R9;
    }
  }
  if (!bVar1) {
    __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                  ,0x8d,
                  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, 2>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, -1, true>, BlockRows = 2, BlockCols = -1, InnerPanel = false]"
                 );
  }
  return;
}

Assistant:

inline Block(XprType& xpr,
          Index a_startRow, Index a_startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, a_startRow, a_startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(a_startRow >= 0 && blockRows >= 0 && a_startRow  <= xpr.rows() - blockRows
          && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols);
    }